

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
pstore::json::details::number_matcher<json_out_callbacks>::do_frac_digit_state
          (number_matcher<json_out_callbacks> *this,parser<json_out_callbacks> *parser,char c)

{
  parser<json_out_callbacks> *ppVar1;
  int iVar2;
  error_code local_40;
  error_code local_30;
  byte local_1a;
  char local_19;
  bool match;
  parser<json_out_callbacks> *ppStack_18;
  char c_local;
  parser<json_out_callbacks> *parser_local;
  number_matcher<json_out_callbacks> *this_local;
  
  local_19 = c;
  ppStack_18 = parser;
  parser_local = (parser<json_out_callbacks> *)this;
  iVar2 = matcher<json_out_callbacks>::get_state(&this->super_matcher<json_out_callbacks>);
  if ((iVar2 != 6) &&
     (iVar2 = matcher<json_out_callbacks>::get_state(&this->super_matcher<json_out_callbacks>),
     iVar2 != 7)) {
    assert_failed("this->get_state () == frac_initial_digit_state || this->get_state () == frac_digit_state"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                  ,0x272);
  }
  local_1a = 1;
  if ((local_19 == 'e') || (local_19 == 'E')) {
    number_is_float(this);
    iVar2 = matcher<json_out_callbacks>::get_state(&this->super_matcher<json_out_callbacks>);
    ppVar1 = ppStack_18;
    if (iVar2 == 6) {
      std::error_code::error_code<pstore::json::error_code,void>(&local_30,unrecognized_token);
      matcher<json_out_callbacks>::set_error
                (&this->super_matcher<json_out_callbacks>,ppVar1,&local_30);
    }
    else {
      matcher<json_out_callbacks>::set_state(&this->super_matcher<json_out_callbacks>,8);
    }
  }
  else if ((local_19 < '0') || ('9' < local_19)) {
    iVar2 = matcher<json_out_callbacks>::get_state(&this->super_matcher<json_out_callbacks>);
    ppVar1 = ppStack_18;
    if (iVar2 == 6) {
      std::error_code::error_code<pstore::json::error_code,void>(&local_40,unrecognized_token);
      matcher<json_out_callbacks>::set_error
                (&this->super_matcher<json_out_callbacks>,ppVar1,&local_40);
    }
    else {
      local_1a = 0;
      complete(this,ppStack_18);
    }
  }
  else {
    number_is_float(this);
    (this->fp_acc_).frac_part = (this->fp_acc_).frac_part * 10.0 + (double)(local_19 + -0x30);
    (this->fp_acc_).frac_scale = (this->fp_acc_).frac_scale * 10.0;
    matcher<json_out_callbacks>::set_state(&this->super_matcher<json_out_callbacks>,7);
  }
  return (bool)(local_1a & 1);
}

Assistant:

bool number_matcher<Callbacks>::do_frac_digit_state (parser<Callbacks> & parser,
                                                                 char const c) {
                PSTORE_ASSERT (this->get_state () == frac_initial_digit_state ||
                               this->get_state () == frac_digit_state);

                bool match = true;
                if (c == 'e' || c == 'E') {
                    this->number_is_float ();
                    if (this->get_state () == frac_initial_digit_state) {
                        this->set_error (parser, error_code::unrecognized_token);
                    } else {
                        this->set_state (exponent_sign_state);
                    }
                } else if (c >= '0' && c <= '9') {
                    this->number_is_float ();
                    fp_acc_.frac_part = fp_acc_.frac_part * 10 + (c - '0');
                    fp_acc_.frac_scale *= 10;

                    this->set_state (frac_digit_state);
                } else {
                    if (this->get_state () == frac_initial_digit_state) {
                        this->set_error (parser, error_code::unrecognized_token);
                    } else {
                        match = false;
                        this->complete (parser);
                    }
                }
                return match;
            }